

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

ShaderExecutor *
deqp::gls::ShaderExecUtil::createExecutor
          (RenderContext *renderCtx,ShaderType shaderType,ShaderSpec *shaderSpec)

{
  ShaderExecutor *pSVar1;
  GeometryShaderExecutor *pGVar2;
  ComputeShaderExecutor *this;
  InternalError *this_00;
  allocator<char> local_41;
  string local_40;
  
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    this = (ComputeShaderExecutor *)operator_new(0x158);
    VertexShaderExecutor::VertexShaderExecutor((VertexShaderExecutor *)this,renderCtx,shaderSpec);
    break;
  case SHADERTYPE_FRAGMENT:
    this = (ComputeShaderExecutor *)operator_new(0x158);
    FragmentShaderExecutor::FragmentShaderExecutor
              ((FragmentShaderExecutor *)this,renderCtx,shaderSpec);
    break;
  case SHADERTYPE_GEOMETRY:
    pGVar2 = GeometryShaderExecutor::create(renderCtx,shaderSpec);
    return (ShaderExecutor *)pGVar2;
  case SHADERTYPE_TESSELLATION_CONTROL:
    pSVar1 = (ShaderExecutor *)TessControlExecutor::create(renderCtx,shaderSpec);
    return pSVar1;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    pSVar1 = (ShaderExecutor *)TessEvaluationExecutor::create(renderCtx,shaderSpec);
    return pSVar1;
  case SHADERTYPE_COMPUTE:
    this = (ComputeShaderExecutor *)operator_new(0x180);
    ComputeShaderExecutor::ComputeShaderExecutor(this,renderCtx,shaderSpec);
    break;
  default:
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unsupported shader type",&local_41);
    tcu::InternalError::InternalError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  return (ShaderExecutor *)this;
}

Assistant:

ShaderExecutor* createExecutor (const glu::RenderContext& renderCtx, glu::ShaderType shaderType, const ShaderSpec& shaderSpec)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					return new VertexShaderExecutor			(renderCtx, shaderSpec);
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		return TessControlExecutor::create		(renderCtx, shaderSpec);
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	return TessEvaluationExecutor::create	(renderCtx, shaderSpec);
		case glu::SHADERTYPE_GEOMETRY:					return GeometryShaderExecutor::create	(renderCtx, shaderSpec);
		case glu::SHADERTYPE_FRAGMENT:					return new FragmentShaderExecutor		(renderCtx, shaderSpec);
		case glu::SHADERTYPE_COMPUTE:					return new ComputeShaderExecutor		(renderCtx, shaderSpec);
		default:
			throw tcu::InternalError("Unsupported shader type");
	}
}